

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.h
# Opt level: O0

void Js::JavascriptArray::
     TemplatedForEachItemInRange<true,Js::RecyclableObject,unsigned_long,Js::JavascriptArray::EntryForEach(Js::RecyclableObject*,Js::CallInfo,___)::__1>
               (RecyclableObject *arr,unsigned_long startIndex,unsigned_long limitIndex,
               ScriptContext *scriptContext,anon_class_40_5_f5da2264 fn)

{
  code *pcVar1;
  anon_class_40_5_f5da2264 fn_00;
  unsigned_long scriptContext_00;
  ScriptContext *limitIndex_00;
  bool bVar2;
  BOOL BVar3;
  JavascriptArray *this;
  uint64 startIndex_00;
  undefined4 *puVar4;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  ScriptContext *local_48;
  RecyclableObject *local_40;
  RecyclableObject *curArr;
  Var element;
  unsigned_long i;
  ScriptContext *scriptContext_local;
  unsigned_long limitIndex_local;
  unsigned_long startIndex_local;
  RecyclableObject *arr_local;
  
  element = (Var)startIndex;
  i = (unsigned_long)scriptContext;
  scriptContext_local = (ScriptContext *)limitIndex;
  limitIndex_local = startIndex;
  startIndex_local = (unsigned_long)arr;
  do {
    if (scriptContext_local <= element) {
      return;
    }
    local_40 = (RecyclableObject *)startIndex_local;
    BVar3 = TryTemplatedGetItem<Js::RecyclableObject,unsigned_long>
                      ((RecyclableObject *)startIndex_local,(unsigned_long)element,&curArr,
                       (ScriptContext *)i,true);
    if (BVar3 != 0) {
      EntryForEach::anon_class_40_5_f5da2264::operator()(&fn,(uint64)element,curArr);
      bVar2 = MayChangeType<Js::RecyclableObject>();
      if ((bVar2) && (bVar2 = VarIsWithoutES5Array<Js::RecyclableObject>(local_40), !bVar2)) {
        bVar2 = IsNonES5Array(local_40);
        if (bVar2) {
          this = UnsafeVarTo<Js::JavascriptArray,Js::RecyclableObject>(local_40);
          limitIndex_00 = scriptContext_local;
          scriptContext_00 = i;
          startIndex_00 = (long)element + 1;
          memcpy(&local_68,&fn,0x28);
          fn_00.callBackFn = (RecyclableObject *)uStack_60;
          fn_00.dynamicObject = (RecyclableObject *)local_68;
          fn_00._16_8_ = local_58;
          fn_00.thisArg = (Var)uStack_50;
          fn_00.scriptContext = local_48;
          ForEachItemInRange<true,Js::JavascriptArray::EntryForEach(Js::RecyclableObject*,Js::CallInfo,___)::__1>
                    (this,startIndex_00,(uint64)limitIndex_00,(ScriptContext *)scriptContext_00,
                     fn_00);
          return;
        }
        bVar2 = VarIs<Js::ES5Array,Js::RecyclableObject>(local_40);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptArray.h"
                                      ,0x2cf,"(VarIs<ES5Array>(curArr))",
                                      "The array should have been converted to an ES5Array");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar4 = 0;
        }
      }
    }
    element = (Var)((long)element + 1);
  } while( true );
}

Assistant:

static void TemplatedForEachItemInRange(T * arr, P startIndex, P limitIndex, ScriptContext * scriptContext, Fn fn)
        {
            for (P i = startIndex; i < limitIndex; i++)
            {
                Var element;
                RecyclableObject* curArr = arr;
                if (TryTemplatedGetItem<T>(curArr, i, &element, scriptContext))
                {
                    fn(i, element);

                    if (hasSideEffect && MayChangeType<T>() && !VarIsWithoutES5Array<T>(curArr))
                    {
                        // The function has changed, go to another ForEachItemInRange. It is possible that the array might have changed to
                        // an ES5Array, in such cases we don't need to call the JavascriptArray specific implementation.
                        if (JavascriptArray::IsNonES5Array(curArr))
                        {
                            UnsafeVarTo<JavascriptArray>(curArr)->template ForEachItemInRange<true>(i + 1, limitIndex, scriptContext, fn);
                            return;
                        }
                        else
                        {
                            AssertOrFailFastMsg(VarIs<ES5Array>(curArr), "The array should have been converted to an ES5Array");
                        }
                    }
                }
            }
        }